

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O3

int pospopcnt_u16_avx512bw_blend_popcnt(uint16_t *data,uint32_t len,uint32_t *flags)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  
  if (len < 0x40) {
    uVar4 = 0;
  }
  else {
    auVar9 = vpbroadcastd_avx512f(ZEXT416(0xff00ff));
    auVar10 = vpbroadcastd_avx512f(ZEXT416(0xff00ff00));
    uVar3 = 0;
    uVar2 = 2;
    do {
      uVar4 = uVar2;
      auVar11 = vmovdqu64_avx512f(*(undefined1 (*) [64])(data + uVar3 * 0x20 + 0x20));
      auVar12 = vmovdqu64_avx512f(*(undefined1 (*) [64])(data + uVar3 * 0x20));
      lVar5 = 0x20;
      auVar8 = vpsllw_avx512bw(auVar11,8);
      auVar11 = vpsrlw_avx512bw(auVar11,8);
      auVar8 = vpternlogd_avx512f(auVar8,auVar12,auVar9,0xf8);
      auVar11 = vpternlogd_avx512f(auVar11,auVar12,auVar10,0xf8);
      do {
        uVar6 = vpmovb2m_avx512bw(auVar8);
        auVar8 = vpaddb_avx512bw(auVar8,auVar8);
        uVar7 = vpmovb2m_avx512bw(auVar11);
        auVar11 = vpaddb_avx512bw(auVar11,auVar11);
        piVar1 = (int *)((long)flags + lVar5 + -4);
        *piVar1 = *piVar1 + (int)POPCOUNT(uVar6);
        piVar1 = (int *)((long)flags + lVar5 + 0x1c);
        *piVar1 = *piVar1 + (int)POPCOUNT(uVar7);
        lVar5 = lVar5 + -4;
      } while (lVar5 != 0);
      uVar3 = uVar4;
      uVar2 = uVar4 + 2;
    } while (uVar4 + 2 <= (ulong)(len >> 5));
    uVar4 = uVar4 << 5;
  }
  if (uVar4 < len) {
    auVar9 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
    auVar10 = vpmovsxbd_avx512f(_DAT_0011f080);
    auVar11 = vpbroadcastd_avx512f(ZEXT416(1));
    do {
      uVar4 = uVar4 + 1;
      auVar12 = vpbroadcastd_avx512f();
      auVar12 = vpsrlvd_avx512f(auVar12,auVar10);
      auVar12 = vpandd_avx512f(auVar12,auVar11);
      auVar9 = vpaddd_avx512f(auVar12,auVar9);
    } while (len != uVar4);
    auVar9 = vmovdqu64_avx512f(auVar9);
    *(undefined1 (*) [64])flags = auVar9;
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx512bw_blend_popcnt(const uint16_t* data, uint32_t len, uint32_t* flags) { 
    const __m512i* data_vectors = (const __m512i*)(data);
    const uint32_t n_cycles = len / 32;

    size_t i = 0;
    for (/**/; i + 2 <= n_cycles; i += 2) {
        __m512i v0 = _mm512_loadu_si512(data_vectors + i + 0);
        __m512i v1 = _mm512_loadu_si512(data_vectors + i + 1);

        __m512i input0 = _mm512_ternarylogic_epi32(v0, _mm512_set1_epi16(0x00FF), _mm512_slli_epi16(v1, 8), AND_OR);
        __m512i input1 = _mm512_ternarylogic_epi32(v0, _mm512_set1_epi16((int16_t)0xFF00), _mm512_srli_epi16(v1, 8), AND_OR);
        
        for (int i = 0; i < 8; ++i) {
            flags[ 7 - i] += _mm_popcnt_u64(_mm512_movepi8_mask(input0));
            flags[15 - i] += _mm_popcnt_u64(_mm512_movepi8_mask(input1));
            input0 = _mm512_add_epi8(input0, input0);
            input1 = _mm512_add_epi8(input1, input1);
        }
    }

    i *= 32;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((data[i] & (1 << j)) >> j);
        }
    }

    return 0;
}